

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O3

void Ivy_TableProfile(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  iVar1 = p->nTableSize;
  if (0 < iVar1) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if (p->pTable[lVar3] == 0) {
        bVar4 = iVar2 != 0;
        iVar2 = 0;
        if (bVar4) {
          iVar2 = 0;
          printf("%d ");
          iVar1 = p->nTableSize;
        }
      }
      else {
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void Ivy_TableProfile( Ivy_Man_t * p )
{
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        if ( p->pTable[i] )
            Counter++;
        else if ( Counter )
        {
            printf( "%d ", Counter );
            Counter = 0;
        }
    }
}